

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.c
# Opt level: O0

int property_set(char *key,char *value)

{
  size_t sVar1;
  ssize_t sVar2;
  char *in_RSI;
  char *in_RDI;
  int result;
  char recvBuf [1];
  char sendBuf [125];
  char local_99 [34];
  char acStack_77 [95];
  char *local_18;
  char *local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  pthread_once(&gInitOnce,init);
  if (gPropFd < 0) {
    local_4 = -1;
  }
  else {
    sVar1 = strlen(local_10);
    if (sVar1 < 0x20) {
      sVar1 = strlen(local_18);
      if (sVar1 < 0x5c) {
        memset(local_99 + 1,0xdd,0x7d);
        local_99[1] = 2;
        strcpy(local_99 + 2,local_10);
        strcpy(acStack_77,local_18);
        pthread_mutex_lock((pthread_mutex_t *)&gPropertyFdLock);
        sVar2 = write(gPropFd,local_99 + 1,0x7d);
        if (sVar2 == 0x7d) {
          sVar2 = read(gPropFd,local_99,1);
          if (sVar2 == 1) {
            pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
            if (local_99[0] == '\x01') {
              local_4 = 0;
            }
            else {
              local_4 = -1;
            }
          }
          else {
            pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
            local_4 = -1;
          }
        }
        else {
          pthread_mutex_unlock((pthread_mutex_t *)&gPropertyFdLock);
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int property_set(const char *key, const char *value)
{
    char sendBuf[1+PROPERTY_KEY_MAX+PROPERTY_VALUE_MAX];
    char recvBuf[1];
    int result = -1;

    //LOGV("PROPERTY SET [%s]: [%s]\n", key, value);

    pthread_once(&gInitOnce, init);
    if (gPropFd < 0)
        return -1;

    if (strlen(key) >= PROPERTY_KEY_MAX) return -1;
    if (strlen(value) >= PROPERTY_VALUE_MAX) return -1;

    memset(sendBuf, 0xdd, sizeof(sendBuf));    // placate valgrind

    sendBuf[0] = (char) kSystemPropertySet;
    strcpy(sendBuf+1, key);
    strcpy(sendBuf+1+PROPERTY_KEY_MAX, value);

    pthread_mutex_lock(&gPropertyFdLock);
    if (write(gPropFd, sendBuf, sizeof(sendBuf)) != sizeof(sendBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    if (read(gPropFd, recvBuf, sizeof(recvBuf)) != sizeof(recvBuf)) {
        pthread_mutex_unlock(&gPropertyFdLock);
        return -1;
    }
    pthread_mutex_unlock(&gPropertyFdLock);

    if (recvBuf[0] != 1)
        return -1;
    return 0;
}